

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_WoW6.cpp
# Opt level: O3

int RootHandler_CreateWoW6(TCascStorage *hs,LPBYTE pbRootFile,DWORD cbRootFile,DWORD dwLocaleMask)

{
  DWORD *pDVar1;
  TFileTreeRoot *this;
  int iVar2;
  LPBYTE pbRootEnd;
  
  iVar2 = 1000;
  if (cbRootFile < 0xd) {
    this = (TFileTreeRoot *)0x0;
  }
  else {
    pbRootEnd = pbRootFile + cbRootFile;
    this = (TFileTreeRoot *)0x0;
    if ((pbRootFile + (ulong)*(uint *)pbRootFile * 4 + 0xc < pbRootEnd) &&
       (pbRootFile + (ulong)*(uint *)pbRootFile * 0x1c + 0xc < pbRootEnd)) {
      this = (TFileTreeRoot *)operator_new(0x78);
      TFileTreeRoot::TFileTreeRoot(this,6);
      (this->super_TRootHandler)._vptr_TRootHandler = (_func_int **)&PTR__TFileTreeRoot_0012db30;
      pDVar1 = &(this->super_TRootHandler).dwRootFlags;
      *(byte *)pDVar1 = (byte)*pDVar1 & 0xfe;
      iVar2 = 0;
      TRootHandler_WoW6::ParseWowRootFile_Level1
                ((TRootHandler_WoW6 *)this,pbRootFile,pbRootEnd,dwLocaleMask,'\0');
      TRootHandler_WoW6::ParseWowRootFile_Level1
                ((TRootHandler_WoW6 *)this,pbRootFile,pbRootEnd,dwLocaleMask,'\x01');
    }
  }
  hs->pRootHandler = &this->super_TRootHandler;
  return iVar2;
}

Assistant:

int RootHandler_CreateWoW6(TCascStorage * hs, LPBYTE pbRootFile, DWORD cbRootFile, DWORD dwLocaleMask)
{
    TRootHandler_WoW6 * pRootHandler = NULL;
    FILE_LOCALE_BLOCK LocaleBlock;
    int nError = ERROR_BAD_FORMAT;

    // Verify whether this is really a WoW block
    if(TRootHandler_WoW6::CaptureLocaleBlock(LocaleBlock, pbRootFile, pbRootFile + cbRootFile))
    {
        pRootHandler = new TRootHandler_WoW6();
        if(pRootHandler != NULL)
        {
            // Load the root directory. If load failed, we free the object
            nError = pRootHandler->Load(pbRootFile, pbRootFile + cbRootFile, dwLocaleMask);
            if(nError != ERROR_SUCCESS)
            {
                delete pRootHandler;
                pRootHandler = NULL;
            }
        }
    }

    // Assign the root directory (or NULL) and return error
    hs->pRootHandler = pRootHandler;
    return nError;
}